

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * fileContent(string *__return_storage_ptr__,string *filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_2b9;
  undefined1 local_2b8 [12];
  undefined1 local_2a8 [12];
  undefined1 local_295;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  istream_type local_220 [8];
  ifstream fs;
  string *filename_local;
  string *source;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter",&local_281)
  ;
  std::operator+(&local_260,&local_280,"/");
  std::operator+(&local_240,&local_260,filename);
  std::ifstream::ifstream(local_220,&local_240,8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  local_295 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2a8,local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2b8);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_2a8._0_8_;
  __beg._M_c = local_2a8._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_2b8._0_8_;
  __end._M_c = local_2b8._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_2b9);
  std::allocator<char>::~allocator(&local_2b9);
  local_295 = 1;
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContent(const std::string & filename)
{
  std::ifstream fs(std::string(RESOURCE_DIR) + "/" + filename);
  std::string source(std::istreambuf_iterator<char>(fs), (std::istreambuf_iterator<char>()));
  return source;
}